

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::AddField
          (Parser *this,StructDef *struct_def,string *name,Type *type,FieldDef **dest)

{
  pointer pcVar1;
  FieldDef *pFVar2;
  StructDef *pSVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  FieldDef *this_00;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  pointer pcVar10;
  undefined8 *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (FieldDef *)operator_new(0x138);
  FieldDef::FieldDef(this_00);
  uVar6 = (uint)(*(int *)&name[8]._M_dataplus._M_p - *(int *)((long)&name[7].field_2 + 8)) >> 3;
  if ((uVar6 & 0xffff) < 0x7ffe) {
    (this_00->value).offset = (short)uVar6 * 2 + 4;
    std::__cxx11::string::_M_assign((string *)this_00);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Definition).file);
    pFVar2 = *dest;
    pSVar3 = (StructDef *)dest[1];
    uVar4 = *(undefined8 *)((long)dest + 0x12);
    *(undefined8 *)((long)&(this_00->value).type.struct_def + 2) = *(undefined8 *)((long)dest + 10);
    *(undefined8 *)((long)&(this_00->value).type.enum_def + 2) = uVar4;
    *(FieldDef **)&(this_00->value).type = pFVar2;
    (this_00->value).type.struct_def = pSVar3;
    if (name[8].field_2._M_local_buf[0] == '\x01') {
      sVar7 = InlineSize((Type *)dest);
      sVar8 = InlineAlignment((Type *)dest);
      uVar9 = *(ulong *)((long)&name[8].field_2 + 8);
      if (uVar9 <= sVar8) {
        uVar9 = sVar8;
      }
      pcVar1 = name[8]._M_dataplus._M_p;
      *(ulong *)((long)&name[8].field_2 + 8) = uVar9;
      pcVar10 = name[9]._M_dataplus._M_p;
      uVar9 = sVar8 - 1 & -(long)pcVar10;
      pcVar10 = pcVar10 + uVar9;
      name[9]._M_dataplus._M_p = pcVar10;
      if (pcVar1 != *(pointer *)((long)&name[7].field_2 + 8)) {
        *(ulong *)(*(long *)(pcVar1 + -8) + 0x128) = uVar9;
      }
      (this_00->value).offset = (voffset_t)pcVar10;
      name[9]._M_dataplus._M_p = pcVar10 + sVar7;
    }
    bVar5 = SymbolTable<flatbuffers::FieldDef>::Add
                      ((SymbolTable<flatbuffers::FieldDef> *)&name[6]._M_string_length,
                       (string *)type,this_00);
    if (bVar5) {
      std::operator+(&local_50,"field already exists: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type);
      Error(this,(string *)struct_def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      *in_R9 = this_00;
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
    return SUB82(this,0);
  }
  __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
}

Assistant:

CheckedError Parser::AddField(StructDef &struct_def, const std::string &name,
                              const Type &type, FieldDef **dest) {
  auto &field = *new FieldDef();
  field.value.offset =
      FieldIndexToOffset(static_cast<voffset_t>(struct_def.fields.vec.size()));
  field.name = name;
  field.file = struct_def.file;
  field.value.type = type;
  if (struct_def.fixed) {  // statically compute the field offset
    auto size = InlineSize(type);
    auto alignment = InlineAlignment(type);
    // structs_ need to have a predictable format, so we need to align to
    // the largest scalar
    struct_def.minalign = std::max(struct_def.minalign, alignment);
    struct_def.PadLastField(alignment);
    field.value.offset = static_cast<voffset_t>(struct_def.bytesize);
    struct_def.bytesize += size;
  }
  if (struct_def.fields.Add(name, &field))
    return Error("field already exists: " + name);
  *dest = &field;
  return NoError();
}